

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.h
# Opt level: O0

void __thiscall miniros::Duration::~Duration(Duration *this)

{
  DurationBase<miniros::Duration> *in_RDI;
  
  DurationBase<miniros::Duration>::~DurationBase(in_RDI);
  return;
}

Assistant:

class MINIROS_DECL Duration : public DurationBase<Duration>
{
public:
  Duration()
  : DurationBase<Duration>()
  { }

  Duration(int32_t _sec, int32_t _nsec)
  : DurationBase<Duration>(_sec, _nsec)
  {}

  explicit Duration(double t) { fromSec(t); }
  explicit Duration(const Rate&);
  /**
   * \brief sleep for the amount of time specified by this Duration.  If a signal interrupts the sleep, resleeps for the time remaining.
   * @return True if the desired sleep duration was met, false otherwise.
   */
  bool sleep() const;
}